

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

result_type __thiscall
math::wide_integer::uniform_int_distribution<64u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<64u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  unsigned_fast_type uVar1;
  bool bVar2;
  local_wide_integer_type lVar3;
  result_type rVar4;
  uint uVar5;
  array<unsigned_int,_2UL> *paVar6;
  iterator puVar7;
  long lVar8;
  undefined5 extraout_var;
  undefined5 extraout_var_00;
  undefined5 extraout_var_01;
  undefined5 extraout_var_02;
  undefined5 extraout_var_03;
  undefined5 extraout_var_04;
  undefined5 extraout_var_05;
  undefined5 extraout_var_06;
  bool local_9d;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  array<unsigned_int,_2UL> local_78;
  result_type range;
  array<unsigned_int,_2UL> local_68;
  undefined8 local_60;
  array<unsigned_int,_2UL> local_58;
  undefined1 local_4d;
  undefined4 local_4c;
  uint8_t next_byte;
  ulong uStack_48;
  uint right_shift_amount;
  unsigned_fast_type j;
  iterator it;
  generator_result_type value;
  uint32_t digits_gtor_ratio;
  uint32_t digits_limb_ratio;
  uint32_t digits_generator_result_type;
  param_type *input_params_local;
  linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator_local;
  uniform_int_distribution<24U,_unsigned_char,_void,_false> *this_local;
  result_type result;
  
  _digits_limb_ratio = input_params;
  input_params_local = (param_type *)input_generator;
  input_generator_local = (linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)this;
  uintwide_t<64u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
  enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std::
  numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
            (&this_local,'\0',
             (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  digits_gtor_ratio = 0x20;
  value = 4;
  it._4_4_ = 4;
  it._0_4_ = 0;
  paVar6 = (array<unsigned_int,_2UL> *)
           uintwide_t<64U,_unsigned_int,_void,_false>::representation
                     ((uintwide_t<64U,_unsigned_int,_void,_false> *)&this_local);
  j = (unsigned_fast_type)detail::array_detail::array<unsigned_int,_2UL>::begin(paVar6);
  uStack_48 = 0;
  while( true ) {
    uVar1 = j;
    paVar6 = (array<unsigned_int,_2UL> *)
             uintwide_t<64U,_unsigned_int,_void,_false>::representation
                       ((uintwide_t<64U,_unsigned_int,_void,_false> *)&this_local);
    puVar7 = detail::array_detail::array<unsigned_int,_2UL>::end(paVar6);
    if ((iterator)uVar1 == puVar7) break;
    if ((uStack_48 & 3) == 0) {
      it._0_4_ = std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                           ((linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)
                            input_params_local);
    }
    lVar8 = (uStack_48 & 3) << 3;
    local_4c = (undefined4)lVar8;
    uVar5 = (result_type)it >> (sbyte)lVar8;
    local_4d = (undefined1)uVar5;
    *(uint *)j = *(uint *)j | (uVar5 & 0xff) << (sbyte)((uStack_48 & 3) << 3);
    uStack_48 = uStack_48 + 1;
    if ((uStack_48 & 3) == 0) {
      j = j + 4;
    }
  }
  local_58.elems[0]._0_3_ =
       uniform_int_distribution<64U,_unsigned_int,_void,_false>::param_type::get_a
                 ((param_type *)_digits_limb_ratio);
  local_58.elems._3_5_ = extraout_var;
  lVar3 = numeric_limits_uintwide_t_base<64U,_unsigned_int,_void,_false>::min();
  local_60 = CONCAT53(extraout_var_00,lVar3.values.super_array<unsigned_char,_3UL>.elems);
  bVar2 = uintwide_t<64U,_unsigned_int,_void,_false>::operator!=
                    ((uintwide_t<64U,_unsigned_int,_void,_false> *)&local_58,
                     (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_60);
  local_9d = true;
  if (!bVar2) {
    local_68.elems[0]._0_3_ =
         uniform_int_distribution<64U,_unsigned_int,_void,_false>::param_type::get_b
                   ((param_type *)_digits_limb_ratio);
    local_68.elems._3_5_ = extraout_var_01;
    lVar3 = numeric_limits_uintwide_t_base<64U,_unsigned_int,_void,_false>::max();
    _range = CONCAT53(extraout_var_02,lVar3.values.super_array<unsigned_char,_3UL>.elems);
    local_9d = uintwide_t<64U,_unsigned_int,_void,_false>::operator!=
                         ((uintwide_t<64U,_unsigned_int,_void,_false> *)&local_68,&range);
  }
  if (local_9d != false) {
    rVar4 = uniform_int_distribution<64U,_unsigned_int,_void,_false>::param_type::get_b
                      ((param_type *)_digits_limb_ratio);
    local_80 = CONCAT53(extraout_var_03,rVar4.values.super_array<unsigned_char,_3UL>.elems);
    rVar4 = uniform_int_distribution<64U,_unsigned_int,_void,_false>::param_type::get_a
                      ((param_type *)_digits_limb_ratio);
    local_88 = CONCAT53(extraout_var_04,rVar4.values.super_array<unsigned_char,_3UL>.elems);
    local_78.elems[0]._0_3_ =
         wide_integer::operator-
                   ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_80,
                    (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_88);
    local_78.elems._3_5_ = extraout_var_05;
    uintwide_t<64U,_unsigned_int,_void,_false>::operator++
              ((uintwide_t<64U,_unsigned_int,_void,_false> *)&local_78);
    uintwide_t<64U,_unsigned_int,_void,_false>::operator%=
              ((uintwide_t<64U,_unsigned_int,_void,_false> *)&this_local,
               (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_78);
    rVar4 = uniform_int_distribution<64U,_unsigned_int,_void,_false>::param_type::get_a
                      ((param_type *)_digits_limb_ratio);
    local_90 = CONCAT53(extraout_var_06,rVar4.values.super_array<unsigned_char,_3UL>.elems);
    uintwide_t<64U,_unsigned_int,_void,_false>::operator+=
              ((uintwide_t<64U,_unsigned_int,_void,_false> *)&this_local,
               (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_90);
  }
  return (result_type)SUB83(this_local,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }